

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O2

void ZXing::Pdf417::RotateArray
               (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                *input,vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       *output)

{
  size_type __new_size;
  pointer pvVar1;
  const_reference cVar2;
  size_type __new_size_00;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t jj;
  size_type sVar7;
  bool bVar8;
  reference rVar9;
  
  pvVar1 = (input->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __new_size_00 =
       ((long)(input->
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28;
  __new_size = (ulong)*(uint *)((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                       super__Bvector_impl_data + 0x18) +
               ((long)(((_Bit_iterator *)
                       ((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                               super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p -
               *(long *)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data) * 8;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(output,__new_size);
  lVar6 = 0;
  sVar7 = __new_size;
  while (bVar8 = sVar7 != 0, sVar7 = sVar7 - 1, bVar8) {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)&(((output->
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
               + lVar6),__new_size_00,false);
    lVar6 = lVar6 + 0x28;
  }
  for (uVar4 = 0; uVar4 != __new_size_00; uVar4 = uVar4 + 1) {
    lVar6 = 0;
    for (sVar7 = 0; __new_size != sVar7; sVar7 = sVar7 + 1) {
      cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((input->
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar4,sVar7);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         ((long)&(((output->
                                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data + lVar6),~uVar4 + __new_size_00);
      puVar3 = rVar9._M_p;
      if (cVar2) {
        uVar5 = rVar9._M_mask | *puVar3;
      }
      else {
        uVar5 = ~rVar9._M_mask & *puVar3;
      }
      *puVar3 = uVar5;
      lVar6 = lVar6 + 0x28;
    }
  }
  return;
}

Assistant:

static void RotateArray(const std::vector<std::vector<bool>>& input, std::vector<std::vector<bool>>& output)
{
	size_t height = input.size();
	size_t width = input[0].size();
	output.resize(width);
	for (size_t i = 0; i < width; ++i) {
		output[i].resize(height);
	}
	for (size_t ii = 0; ii < height; ++ii) {
		// This makes the direction consistent on screen when rotating the screen
		size_t inverseii = height - ii - 1;
		for (size_t jj = 0; jj < width; ++jj) {
			output[jj][inverseii] = input[ii][jj];
		}
	}
}